

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmTargetTraceDependencies::CheckCustomCommands
          (cmTargetTraceDependencies *this,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands)

{
  bool bVar1;
  reference cc;
  cmCustomCommand *command;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *__range1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands_local;
  cmTargetTraceDependencies *this_local;
  
  __end1 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(commands);
  command = (cmCustomCommand *)
            std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end(commands);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                                *)&command);
    if (!bVar1) break;
    cc = __gnu_cxx::
         __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
         ::operator*(&__end1);
    CheckCustomCommand(this,cc);
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::CheckCustomCommands(
  const std::vector<cmCustomCommand>& commands)
{
  for (cmCustomCommand const& command : commands) {
    this->CheckCustomCommand(command);
  }
}